

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console_reporter.cc
# Opt level: O0

bool __thiscall benchmark::ConsoleReporter::ReportContext(ConsoleReporter *this,Context *context)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  allocator local_69;
  string local_68 [32];
  int local_48;
  int output_width;
  string local_38 [32];
  Context *local_18;
  Context *context_local;
  ConsoleReporter *this_local;
  
  this->name_field_width_ = context->name_field_width;
  local_18 = context;
  context_local = (Context *)this;
  poVar3 = std::operator<<((ostream *)&std::cerr,"Run on (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18->num_cpus);
  poVar3 = std::operator<<(poVar3," X ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18->mhz_per_cpu);
  poVar3 = std::operator<<(poVar3," MHz CPU ");
  pcVar1 = ".[\\*^$\n";
  if (1 < local_18->num_cpus) {
    pcVar1 = "\"%s\": %s";
  }
  poVar3 = std::operator<<(poVar3,pcVar1 + 7);
  std::operator<<(poVar3,")\n");
  LocalDateTimeString_abi_cxx11_();
  poVar3 = std::operator<<((ostream *)&std::cerr,local_38);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string(local_38);
  if ((local_18->cpu_scaling_enabled & 1U) != 0) {
    std::operator<<((ostream *)&std::cerr,
                    "***WARNING*** CPU scaling is enabled, the benchmark real time measurements may be noisy and will incure extra overhead.\n"
                   );
  }
  std::operator<<((ostream *)&std::cerr,
                  "***WARNING*** Library was built as DEBUG. Timings may be affected.\n");
  local_48 = fprintf(_stdout,"%-*s %10s %10s %10s\n",(ulong)(uint)this->name_field_width_,
                     "Benchmark","Time(ns)","CPU(ns)","Iterations");
  iVar2 = local_48 + -1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,(long)iVar2,'-',&local_69);
  poVar3 = std::operator<<((ostream *)&std::cout,local_68);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return true;
}

Assistant:

bool ConsoleReporter::ReportContext(const Context& context) {
  name_field_width_ = context.name_field_width;

  std::cerr << "Run on (" << context.num_cpus << " X " << context.mhz_per_cpu
            << " MHz CPU " << ((context.num_cpus > 1) ? "s" : "") << ")\n";

  std::cerr << LocalDateTimeString() << "\n";

  if (context.cpu_scaling_enabled) {
    std::cerr << "***WARNING*** CPU scaling is enabled, the benchmark "
                 "real time measurements may be noisy and will incure extra "
                 "overhead.\n";
  }

#ifndef NDEBUG
  std::cerr << "***WARNING*** Library was built as DEBUG. Timings may be "
               "affected.\n";
#endif

  int output_width = fprintf(stdout, "%-*s %10s %10s %10s\n",
                             static_cast<int>(name_field_width_), "Benchmark",
                             "Time(ns)", "CPU(ns)", "Iterations");
  std::cout << std::string(output_width - 1, '-') << "\n";

  return true;
}